

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O2

bool __thiscall
ConsistencyChecker::checkOpMisuse(ConsistencyChecker *this,OpTpl *op,Constructor *ct)

{
  VarnodeTpl *pVVar1;
  SleighCompile *this_00;
  char cVar2;
  Location *loc;
  allocator local_39;
  string local_38;
  
  if (op->opc == CPUI_INT_LESS) {
    pVVar1 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    cVar2 = ConstTpl::isConstSpace();
    if (((cVar2 != '\0') && (*(int *)(pVVar1 + 0x20) == 0)) && (*(long *)(pVVar1 + 0x30) == 0)) {
      this_00 = this->compiler;
      loc = SleighCompile::getLocation(this_00,ct);
      std::__cxx11::string::string
                ((string *)&local_38,"Unsigned comparison with zero is always false",&local_39);
      SleighCompile::reportWarning(this_00,loc,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return true;
}

Assistant:

bool ConsistencyChecker::checkOpMisuse(OpTpl *op,Constructor *ct)

{
  switch(op->getOpcode()) {
  case CPUI_INT_LESS:
    {
      VarnodeTpl *vn = op->getIn(1);
      if (vn->getSpace().isConstSpace() && vn->getOffset().isZero()) {
	compiler->reportWarning(compiler->getLocation(ct), "Unsigned comparison with zero is always false");
      }
    }
    break;
  default:
    break;
  }
  return true;
}